

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetPreconditioner(void *arkode_mem,ARKLsPrecSetupFn psetup,ARKLsPrecSolveFn psolve)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  long in_RDX;
  long in_RSI;
  ARKodeMem in_RDI;
  int retval;
  SUNPSolveFn arkls_psolve;
  SUNPSetupFn arkls_psetup;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  long local_30;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x349,"ARKodeSetPreconditioner",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x352,"ARKodeSetPreconditioner",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not require an algebraic solver");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                               (ARKLsMem *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (local_4 == 0) {
      if (*(long *)(*(long *)(*(long *)(local_30 + 0x38) + 8) + 0x18) == 0) {
        arkProcessError(in_RDI,-3,0x35e,"ARKodeSetPreconditioner",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"SUNLinearSolver object does not support user-supplied preconditioning");
        local_4 = -3;
      }
      else {
        *(long *)(local_30 + 0xd0) = in_RSI;
        *(long *)(local_30 + 0xd8) = in_RDX;
        pcVar2 = arkLsPSetup;
        if (in_RSI == 0) {
          pcVar2 = (code *)0x0;
        }
        pcVar3 = arkLsPSolve;
        if (in_RDX == 0) {
          pcVar3 = (code *)0x0;
        }
        iVar1 = SUNLinSolSetPreconditioner(*(undefined8 *)(local_30 + 0x38),in_RDI,pcVar2,pcVar3);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          arkProcessError(in_RDI,-0xc,0x36f,"ARKodeSetPreconditioner",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"Error in calling SUNLinSolSetPreconditioner");
          local_4 = -0xc;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetPreconditioner(void* arkode_mem, ARKLsPrecSetupFn psetup,
                            ARKLsPrecSolveFn psolve)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  SUNPSetupFn arkls_psetup;
  SUNPSolveFn arkls_psolve;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (arkls_mem->LS->ops->setpreconditioner == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines */
  arkls_mem->pset   = psetup;
  arkls_mem->psolve = psolve;

  /* notify linear solver to call ARKLs interface routines */
  arkls_psetup = (psetup == NULL) ? NULL : arkLsPSetup;
  arkls_psolve = (psolve == NULL) ? NULL : arkLsPSolve;
  retval = SUNLinSolSetPreconditioner(arkls_mem->LS, ark_mem, arkls_psetup,
                                      arkls_psolve);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (ARKLS_SUNLS_FAIL);
  }

  return (ARKLS_SUCCESS);
}